

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O3

string * __thiscall
lf::base::Timer::Format_abi_cxx11_(string *__return_storage_ptr__,Timer *this,string_view format)

{
  long lVar1;
  long lVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  double local_a8 [2];
  double local_98;
  double local_88;
  double local_78;
  double local_68;
  char *local_58;
  undefined4 local_50;
  char *local_48;
  undefined4 local_40;
  char *local_38;
  undefined4 local_30;
  char *local_28;
  undefined4 local_20;
  char *local_18;
  undefined4 local_10;
  
  fmt.data_ = (char *)format._M_len;
  lVar1 = (this->times_).user.__r;
  lVar2 = (this->times_).system.__r;
  local_a8[0] = (double)(this->times_).wall.__r / 1000000000.0;
  local_78 = (double)(lVar1 + lVar2) / 1000000000.0;
  local_98 = (double)lVar1 / 1000000000.0;
  local_88 = (double)lVar2 / 1000000000.0;
  local_68 = (local_78 / local_a8[0]) * 100.0;
  local_58 = "w";
  local_50 = 0;
  local_48 = "u";
  local_40 = 1;
  local_38 = "s";
  local_30 = 2;
  local_28 = "t";
  local_20 = 3;
  local_18 = "p";
  local_10 = 4;
  fmt.size_ = 0x40000000000aaaaa;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_a8;
  ::fmt::v10::vformat_abi_cxx11_(__return_storage_ptr__,(v10 *)format._M_str,fmt,args);
  return __return_storage_ptr__;
}

Assistant:

std::string Timer::Format(std::string_view format) const {
  const double sec = 1000000000.0L;
  const double wall_sec = static_cast<double>(times_.wall.count()) / sec;
  const auto total = times_.system.count() + times_.user.count();
  const double total_sec = static_cast<double>(total) / sec;
  const double percent = (total_sec / wall_sec) * 100.0;

  return fmt::format(
      fmt::runtime(format), fmt::arg("w", wall_sec),
      fmt::arg("u", static_cast<double>(times_.user.count()) / sec),
      fmt::arg("s", static_cast<double>(times_.system.count()) / sec),
      fmt::arg("t", total_sec), fmt::arg("p", percent));
}